

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O2

int ngram_model_casefold(ngram_model_t *model,int kase)

{
  uint8 uVar1;
  hash_table_t *h;
  char *orig;
  void *pvVar2;
  void *val;
  
  uVar1 = model->writable;
  model->writable = '\x01';
  h = hash_table_new(model->n_words,0);
  for (val = (void *)0x0; (long)val < (long)model->n_words; val = (void *)((long)val + 1)) {
    orig = model->word_str[(long)val];
    if (uVar1 == '\0') {
      orig = __ckd_salloc__(orig,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                            ,0x147);
    }
    if ((*orig != '<') && (*orig != '[')) {
      if (kase == 1) {
        lcase(orig);
      }
      else if (kase == 0) {
        ucase(orig);
      }
    }
    model->word_str[(long)val] = orig;
    pvVar2 = hash_table_enter(h,model->word_str[(long)val],val);
    if (val != (void *)((ulong)pvVar2 & 0xffffffff)) {
      err_msg(ERR_WARN,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
              ,0x15e,"Duplicate word in dictionary after conversion: %s\n",
              model->word_str[(long)val]);
    }
  }
  hash_table_free(model->wid);
  model->wid = h;
  return 0;
}

Assistant:

int
ngram_model_casefold(ngram_model_t * model, int kase)
{
    int writable, i;
    hash_table_t *new_wid;

    /* Were word strings already allocated? */
    writable = model->writable;
    /* Either way, we are going to allocate some word strings. */
    model->writable = TRUE;

    /* And, don't forget, we need to rebuild the word to unigram ID
     * mapping. */
    new_wid = hash_table_new(model->n_words, FALSE);
    for (i = 0; i < model->n_words; ++i) {
        char *outstr;
        if (writable) {
            outstr = model->word_str[i];
        }
        else {
            outstr = ckd_salloc(model->word_str[i]);
        }
        /* Don't case-fold <tags> or [classes] */
        if (outstr[0] == '<' || outstr[0] == '[') {
        }
        else {
            switch (kase) {
            case NGRAM_UPPER:
                ucase(outstr);
                break;
            case NGRAM_LOWER:
                lcase(outstr);
                break;
            default:
                ;
            }
        }
        model->word_str[i] = outstr;

        /* Now update the hash table.  We might have terrible
         * collisions here, so warn about them. */
        if (hash_table_enter_int32(new_wid, model->word_str[i], i) != i) {
            E_WARN("Duplicate word in dictionary after conversion: %s\n",
                   model->word_str[i]);
        }
    }
    /* Swap out the hash table. */
    hash_table_free(model->wid);
    model->wid = new_wid;
    return 0;
}